

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::class_<SupportType>::class_<>(class_<SupportType> *this,handle scope,char *name)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  type_record record;
  type_record *in_stack_00000188;
  generic_type *in_stack_00000190;
  type_record *in_stack_ffffffffffffff60;
  undefined8 local_80;
  undefined8 local_78;
  pointer_____offset_0x10___ *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  code *local_48;
  code *local_40;
  byte local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RSI;
  pybind11::detail::generic_type::generic_type((generic_type *)in_stack_ffffffffffffff60);
  pybind11::detail::type_record::type_record(in_stack_ffffffffffffff60);
  local_80 = local_8;
  local_78 = local_18;
  local_70 = &SupportType::typeinfo;
  local_68 = 1;
  local_60 = 1;
  local_58 = 8;
  local_48 = init_instance;
  local_40 = dealloc;
  local_20 = local_20 | 8;
  pybind11::detail::set_operator_new<SupportType>(&local_80);
  pybind11::detail::process_attributes<>::init((EVP_PKEY_CTX *)&local_80);
  pybind11::detail::generic_type::initialize(in_stack_00000190,in_stack_00000188);
  pybind11::detail::type_record::~type_record((type_record *)0x3ad683);
  return;
}

Assistant:

class_(handle scope, const char *name, const Extra &... extra) {
        using namespace detail;

        // MI can only be specified via class_ template options, not constructor parameters
        static_assert(
            none_of<is_pyobject<Extra>...>::value || // no base class arguments, or:
            (   constexpr_sum(is_pyobject<Extra>::value...) == 1 && // Exactly one base
                constexpr_sum(is_base<options>::value...)   == 0 && // no template option bases
                none_of<std::is_same<multiple_inheritance, Extra>...>::value), // no multiple_inheritance attr
            "Error: multiple inheritance bases must be specified via class_ template options");

        type_record record;
        record.scope = scope;
        record.name = name;
        record.type = &typeid(type);
        record.type_size = sizeof(conditional_t<has_alias, type_alias, type>);
        record.type_align = alignof(conditional_t<has_alias, type_alias, type>&);
        record.holder_size = sizeof(holder_type);
        record.init_instance = init_instance;
        record.dealloc = dealloc;
        record.default_holder = detail::is_instantiation<std::unique_ptr, holder_type>::value;

        set_operator_new<type>(&record);

        /* Register base classes specified via template arguments to class_, if any */
        PYBIND11_EXPAND_SIDE_EFFECTS(add_base<options>(record));

        /* Process optional arguments, if any */
        process_attributes<Extra...>::init(extra..., &record);

        generic_type::initialize(record);

        if (has_alias) {
            auto &instances = record.module_local ? registered_local_types_cpp() : get_internals().registered_types_cpp;
            instances[std::type_index(typeid(type_alias))] = instances[std::type_index(typeid(type))];
        }
    }